

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgconvert.cpp
# Opt level: O0

string * __thiscall Converter::header_abi_cxx11_(string *__return_storage_ptr__,Converter *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  const_reference args_00;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  size_t i;
  string local_c8;
  string local_a8;
  undefined1 local_85;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string guard;
  Converter *this_local;
  string *result;
  
  guard.field_2._8_8_ = this;
  toUpperCase(&local_78,&this->_name);
  std::operator+(&local_58,"__",&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"_H__");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_85 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  tinyformat::format<std::__cxx11::string>(&local_a8,(tinyformat *)"#ifndef %s\n",local_38,in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  tinyformat::format<std::__cxx11::string>(&local_c8,(tinyformat *)"#define %s\n",local_38,in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#include \"BitmapIcon.h\"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  tinyformat::format<std::__cxx11::string>
            ((string *)&i,(tinyformat *)"static uint8_t %s_bitmap[] = {\n",(char *)&this->_name,
             in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  for (local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pbVar1 = local_f0,
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bitmap),
      pbVar1 < args;
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_f0->field_0x1) {
    if (((ulong)local_f0 & 0xf) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    ");
    }
    args_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        (&this->_bitmap,(size_type)local_f0);
    tinyformat::format<unsigned_char>(&local_110,"0x%02x",args_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pbVar1 = local_f0;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bitmap);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar2 - 1);
    if (pbVar1 == args) break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    if (((ulong)local_f0 & 0xf) == 0xf) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
  }
  tinyformat::format<>(&local_130,"\n};\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  tinyformat::format<std::__cxx11::string>
            (&local_150,(tinyformat *)"static BitmapIcon %s = {\n",(char *)&this->_name,args);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  tinyformat::format<int,int,int,std::__cxx11::string>
            (&local_170,(tinyformat *)"    %d, %d, %d, %s_bitmap\n",(char *)&this->_width,
             &this->_height,&this->_bpp,(int *)&this->_name,in_stack_fffffffffffffe18);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"};\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  std::operator+(&local_1b0,"#endif // ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_190,&local_1b0,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  local_85 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string header() const {
        std::string guard = "__" + toUpperCase(_name) + "_H__";

        std::string result;
        result += tfm::format("#ifndef %s\n", guard);
        result += tfm::format("#define %s\n", guard);
        result += "\n";
        result += "#include \"BitmapIcon.h\"\n";
        result += "\n";

        result += tfm::format("static uint8_t %s_bitmap[] = {\n", _name);
        for (size_t i = 0; i < _bitmap.size(); ++i) {
            if (i % 16 == 0) {
                result += "    ";
            }
            result += tfm::format("0x%02x", _bitmap[i]);
            if (i == _bitmap.size() - 1) {
                break;
            }
            result += ", ";
            if (i % 16 == 15) {
                result += "\n";
            }
        }
        result += tfm::format("\n};\n");
        result += "\n";

        result += tfm::format("static BitmapIcon %s = {\n", _name);
        result += tfm::format("    %d, %d, %d, %s_bitmap\n", _width, _height, _bpp, _name);
        result += "};\n";

        result += "\n";
        result += "#endif // " + guard + "\n";

        return result;
    }